

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O3

bool wasm::Match::Internal::
     Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
     ::match(matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
             candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
            *matchers)

{
  matched_t<wasm::Binary_*> pBVar1;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  *pMVar2;
  BinaryOp *pBVar3;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *ppEVar4;
  matched_t<wasm::Const_*> pCVar5;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *pMVar6;
  matched_t<wasm::Const_*> *ppCVar7;
  bool bVar8;
  Literal local_40;
  
  pBVar1 = (matched_t<wasm::Binary_*>)candidate->left;
  if ((pBVar1->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
  {
    pMVar2 = matchers->curr;
    if (pMVar2->binder != (matched_t<wasm::Binary_*> *)0x0) {
      *pMVar2->binder = pBVar1;
    }
    pBVar3 = (pMVar2->submatchers).curr.binder;
    if (pBVar3 != (BinaryOp *)0x0) {
      *pBVar3 = pBVar1->op;
    }
    ppEVar4 = ((pMVar2->submatchers).next.curr)->binder;
    if (ppEVar4 != (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
      *ppEVar4 = pBVar1->left;
    }
    pCVar5 = (matched_t<wasm::Const_*>)pBVar1->right;
    if ((pCVar5->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id == ConstId
       ) {
      pMVar6 = (pMVar2->submatchers).next.next.curr;
      ppCVar7 = pMVar6->binder;
      if (ppCVar7 != (matched_t<wasm::Const_*> *)0x0) {
        *ppCVar7 = pCVar5;
      }
      Literal::Literal(&local_40,&pCVar5->value);
      bVar8 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
              ::matches(&(pMVar6->submatchers).curr,&local_40);
      Literal::~Literal(&local_40);
      if ((bVar8) &&
         (pCVar5 = (matched_t<wasm::Const_*>)candidate->right,
         (pCVar5->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id ==
         ConstId)) {
        pMVar6 = (matchers->next).curr;
        ppCVar7 = pMVar6->binder;
        if (ppCVar7 != (matched_t<wasm::Const_*> *)0x0) {
          *ppCVar7 = pCVar5;
        }
        Literal::Literal(&local_40,&pCVar5->value);
        bVar8 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                ::matches(&(pMVar6->submatchers).curr,&local_40);
        Literal::~Literal(&local_40);
        return bVar8;
      }
    }
  }
  return false;
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }